

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRDisplayNode::render
          (VRDisplayNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  bool bVar1;
  size_type sVar2;
  iterator this_00;
  reference ppVVar3;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *in_RDI;
  iterator it;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  in_stack_ffffffffffffffd0;
  int iVar4;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  local_20;
  undefined8 *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::size
                    ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                     &(in_RDI->
                      super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  if (sVar2 == 0) {
    (**(code **)*local_18)(local_18,local_10);
  }
  else {
    local_20._M_current =
         (VRDisplayNode **)
         std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin(in_RDI)
    ;
    while( true ) {
      this_00 = std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
                          (in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                          *)in_stack_ffffffffffffffd0._M_current,
                         (__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                          *)in_RDI);
      iVar4 = (int)((ulong)in_stack_ffffffffffffffd0._M_current >> 0x20);
      if (!bVar1) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                ::operator*(&local_20);
      (*(*ppVVar3)->_vptr_VRDisplayNode[4])(*ppVVar3,local_10,local_18);
      in_stack_ffffffffffffffd0 =
           __gnu_cxx::
           __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
           ::operator++(this_00._M_current,iVar4);
    }
  }
  return;
}

Assistant:

void VRDisplayNode::render(VRDataIndex *renderState,
                           VRRenderHandler *renderHandler) {
  if (_children.size() > 0) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin();
         it != _children.end(); it++) {
			(*it)->render(renderState, renderHandler);
		}
	} else {
		renderHandler->onVRRenderScene(*renderState);
	}
}